

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O2

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _w;
  int _h;
  int _h_00;
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  Mat local_78;
  Option *local_38;
  
  iVar7 = bottom_blob->dims;
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  _h_00 = bottom_blob->c;
  pvVar2 = (this->axes).data;
  if ((pvVar2 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    bVar12 = this->squeeze_w != 0 && _w == 1;
    bVar13 = this->squeeze_h != 0 && _h == 1;
    bVar9 = this->squeeze_c != 0 && _h_00 == 1;
  }
  else {
    uVar1 = (this->axes).w;
    bVar14 = _w == 1;
    uVar10 = 0;
    uVar8 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar8 = uVar10;
    }
    bVar12 = false;
    bVar13 = false;
    bVar9 = false;
    for (; local_38 = opt, uVar8 != uVar10; uVar10 = uVar10 + 1) {
      iVar11 = *(int *)((long)pvVar2 + uVar10 * 4);
      iVar11 = (iVar11 >> 0x1f & iVar7 + 1U) + iVar11;
      bVar3 = bVar12;
      bVar5 = bVar13;
      bVar6 = bVar9;
      if (iVar11 == 1) {
        bVar3 = bVar14;
        bVar5 = _h == 1;
        bVar6 = _h_00 == 1;
      }
      if (iVar7 != 2) {
        bVar5 = bVar13;
      }
      if (iVar7 != 1) {
        bVar3 = bVar12;
      }
      bVar4 = bVar3;
      bVar13 = bVar5;
      if (iVar11 == 2) {
        bVar4 = bVar14;
        bVar13 = _h == 1;
      }
      if (iVar7 != 2) {
        bVar4 = bVar3;
      }
      bVar12 = bVar4;
      if (iVar11 == 3) {
        bVar12 = bVar14;
      }
      if (iVar7 != 3) {
        bVar12 = bVar4;
        bVar13 = bVar5;
        bVar6 = bVar9;
      }
      bVar9 = bVar6;
    }
  }
  Mat::operator=(top_blob,bottom_blob);
  if (iVar7 == 3) {
    if (bVar12) {
      if (bVar13) {
        if (bVar9) {
          Mat::reshape(&local_78,bottom_blob,1,opt->blob_allocator);
          Mat::operator=(top_blob,&local_78);
        }
        else {
          Mat::reshape(&local_78,bottom_blob,_h_00,opt->blob_allocator);
          Mat::operator=(top_blob,&local_78);
        }
      }
      else if (bVar9) {
        Mat::reshape(&local_78,bottom_blob,_h,opt->blob_allocator);
        Mat::operator=(top_blob,&local_78);
      }
      else {
        Mat::reshape(&local_78,bottom_blob,_h,_h_00,opt->blob_allocator);
        Mat::operator=(top_blob,&local_78);
      }
    }
    else if (bVar13) {
      if (bVar9) {
        Mat::reshape(&local_78,bottom_blob,_w,opt->blob_allocator);
        Mat::operator=(top_blob,&local_78);
      }
      else {
        Mat::reshape(&local_78,bottom_blob,_w,_h_00,opt->blob_allocator);
        Mat::operator=(top_blob,&local_78);
      }
    }
    else {
      if (!bVar9) goto LAB_00167580;
      Mat::reshape(&local_78,bottom_blob,_w,_h,opt->blob_allocator);
      Mat::operator=(top_blob,&local_78);
    }
  }
  else if (iVar7 == 2) {
    if (bVar12) {
      if (bVar13) {
        Mat::reshape(&local_78,bottom_blob,1,opt->blob_allocator);
        Mat::operator=(top_blob,&local_78);
      }
      else {
        Mat::reshape(&local_78,bottom_blob,_h,opt->blob_allocator);
        Mat::operator=(top_blob,&local_78);
      }
    }
    else {
      if (!bVar13) goto LAB_00167580;
      Mat::reshape(&local_78,bottom_blob,_w,opt->blob_allocator);
      Mat::operator=(top_blob,&local_78);
    }
  }
  else {
    if ((iVar7 != 1) || (!bVar12)) goto LAB_00167580;
    Mat::reshape(&local_78,bottom_blob,1,opt->blob_allocator);
    Mat::operator=(top_blob,&local_78);
  }
  Mat::~Mat(&local_78);
LAB_00167580:
  if ((top_blob->data == (void *)0x0) || (iVar7 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar7 = -100;
  }
  return iVar7;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _squeeze_w = false;
    bool _squeeze_h = false;
    bool _squeeze_c = false;

    if (axes.empty())
    {
        _squeeze_w = w == 1 && squeeze_w;
        _squeeze_h = h == 1 && squeeze_h;
        _squeeze_c = channels == 1 && squeeze_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i=0; i<axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + 1 + axis;// +1 for N-dim

            if (dims == 1 && axis == 1)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 2 && axis == 1)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 2 && axis == 2)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 3 && axis == 1)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 3 && axis == 2)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 3 && axis == 3)
            {
                _squeeze_w = w == 1;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}